

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O3

void __thiscall
cmParseMumpsCoverage::cmParseMumpsCoverage
          (cmParseMumpsCoverage *this,cmCTestCoverageHandlerContainer *cont,cmCTest *ctest)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_cmParseMumpsCoverage = (_func_int **)&PTR__cmParseMumpsCoverage_006b5740;
  p_Var1 = &(this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header;
  (this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->RoutineToDirectory)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Coverage = cont;
  this->CTest = ctest;
  return;
}

Assistant:

cmParseMumpsCoverage::cmParseMumpsCoverage(
  cmCTestCoverageHandlerContainer& cont,
  cmCTest* ctest)
  :Coverage(cont), CTest(ctest)
{
}